

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

int prvTidyHTMLVersion(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  pLVar1 = doc->lexer;
  uVar5 = pLVar1->doctype;
  uVar6 = *(uint *)((doc->config).value + 0xe);
  if ((*(int *)((doc->config).value + 100) == 0) && (pLVar1->isvoyager == no)) {
    bVar8 = false;
  }
  else {
    bVar8 = *(int *)((doc->config).value + 0x21) == 0;
  }
  bVar7 = 1 < uVar6 - 3;
  bVar9 = (uVar5 & 0x1ffc) == 0;
  iVar2 = (uint)bVar8 * 0x20000 + 0x20000;
  if (((uVar5 == 0) || (iVar2 = 0x20000, (uVar5 != 0x60000 | bVar8) != 1)) ||
     (((((bVar9 && bVar7) && (uVar6 & 0xfffffffd) == 0) & bVar8) == 1 &&
      (iVar2 = 0x40000, (pLVar1->versions & 0x60000) == 0x40000)))) {
    return iVar2;
  }
  uVar5 = 0;
  puVar4 = &W3C_Doctypes[0].vers;
  uVar3 = 0;
  for (uVar6 = 0; uVar6 != 0x13; uVar6 = uVar6 + 1) {
    if ((((bVar8 == false) || ((*puVar4 & 0x41f00) != 0)) &&
        (bVar9 && bVar7 || (*puVar4 & 0x1ffc) != 0)) &&
       (((*puVar4 & pLVar1->versions) != 0 && (((_doctypes *)(puVar4 + -1))->score <= uVar5 - 1))))
    {
      uVar3 = (ulong)uVar6;
      uVar5 = ((_doctypes *)(puVar4 + -1))->score;
    }
    puVar4 = puVar4 + 10;
  }
  if (uVar5 != 0) {
    return W3C_Doctypes[uVar3].vers;
  }
  return 0;
}

Assistant:

int TY_(HTMLVersion)(TidyDocImpl* doc)
{
    uint i;
    uint j = 0;
    uint score = 0;
    uint vers = doc->lexer->versions;
    uint dtver = doc->lexer->doctype;
    TidyDoctypeModes dtmode = (TidyDoctypeModes)cfg(doc, TidyDoctypeMode);
    Bool xhtml = (cfgBool(doc, TidyXmlOut) || doc->lexer->isvoyager) &&
                 !cfgBool(doc, TidyHtmlOut);
    Bool html4 = ((dtmode == TidyDoctypeStrict) || (dtmode == TidyDoctypeLoose) ||
                  (VERS_HMTL40PX & dtver) ? yes : no);
    Bool html5 = (!html4 && ((dtmode == TidyDoctypeAuto) ||
                  (dtmode == TidyDoctypeHtml5)) ? yes : no);

    if (xhtml && dtver == VERS_UNKNOWN) return XH50;
    if (dtver == VERS_UNKNOWN) return HT50;
    /* Issue #167 - if NOT XHTML, and doctype is default VERS_HTML5, then return HT50 */
    if (!xhtml && (dtver == VERS_HTML5)) return HT50;
    /* Issue #377 - If xhtml and (doctype == html5) and constrained vers contains XH50 return that,
       and really if tidy defaults to 'html5', then maybe 'auto' should also apply! */
    if (xhtml && html5 && ((vers & VERS_HTML5) == XH50)) return XH50;

    for (i = 0; W3C_Doctypes[i].name; ++i)
    {
        if ((xhtml && !(VERS_XHTML & W3C_Doctypes[i].vers)) ||
            (html4 && !(VERS_HMTL40PX & W3C_Doctypes[i].vers)))
            continue;

        if (vers & W3C_Doctypes[i].vers &&
            (W3C_Doctypes[i].score < score || !score))
        {
            score = W3C_Doctypes[i].score;
            j = i;
        }
    }

    if (score)
        return W3C_Doctypes[j].vers;

    return VERS_UNKNOWN;
}